

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgraphelt3d.cpp
# Opt level: O0

void __thiscall
TPZGraphElT3d::QsiEta(TPZGraphElT3d *this,TPZVec<int> *i,int imax,TPZVec<double> *qsieta)

{
  double *pdVar1;
  double dVar2;
  TPZVec<double> *in_RCX;
  double dVar3;
  double dVar4;
  REAL temp [3];
  TPZVec<double> *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  TPZVec<int> *in_stack_ffffffffffffffb8;
  TPZGraphEl *in_stack_ffffffffffffffc0;
  
  TPZGraphEl::QsiEta(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8);
  pdVar1 = TPZVec<double>::operator[](in_RCX,1);
  dVar2 = *pdVar1;
  pdVar1 = TPZVec<double>::operator[](in_RCX,0);
  dVar3 = *pdVar1;
  pdVar1 = TPZVec<double>::operator[](in_RCX,2);
  dVar3 = ((dVar2 + -1.0) * (dVar3 + 1.0) * (*pdVar1 + -1.0)) / 8.0;
  pdVar1 = TPZVec<double>::operator[](in_RCX,1);
  dVar2 = -(*pdVar1 + 1.0);
  pdVar1 = TPZVec<double>::operator[](in_RCX,2);
  dVar2 = (dVar2 * (*pdVar1 + -1.0)) / 4.0;
  pdVar1 = TPZVec<double>::operator[](in_RCX,2);
  dVar4 = (*pdVar1 + 1.0) / 2.0;
  pdVar1 = TPZVec<double>::operator[](in_RCX,0);
  *pdVar1 = dVar3;
  pdVar1 = TPZVec<double>::operator[](in_RCX,1);
  *pdVar1 = dVar2;
  pdVar1 = TPZVec<double>::operator[](in_RCX,2);
  *pdVar1 = dVar4;
  return;
}

Assistant:

void TPZGraphElT3d::QsiEta(TPZVec<int> &i, int imax, TPZVec<REAL> &qsieta)
{
	TPZGraphElQ3dd::QsiEta(i,imax,qsieta);
	REAL temp[3];
	temp[0] = (-1.+qsieta[1])*(1.+qsieta[0])*(-1.+qsieta[2])/8.;
	temp[1] = -(1.+qsieta[1])*(-1.+qsieta[2])/4.;
	temp[2] = (1.+qsieta[2])/2.;
	qsieta[0] = temp[0];
	qsieta[1] = temp[1];
	qsieta[2] = temp[2];
}